

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O2

void __thiscall IO::Reaction::setArrhenius(Reaction *this,double A,double n,double E,bool reverse)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,reverse) == 0) {
    lVar1 = 0x78;
    lVar2 = 0x70;
    lVar3 = 0x68;
  }
  else {
    this->flagHasREV_ = true;
    lVar1 = 0x90;
    lVar2 = 0x88;
    lVar3 = 0x80;
  }
  *(double *)(&this->flagReversible_ + lVar3) = A;
  *(double *)(&this->flagReversible_ + lVar2) = n;
  *(double *)(&this->flagReversible_ + lVar1) = E;
  return;
}

Assistant:

void IO::Reaction::setArrhenius
(
    double A,
    double n,
    double E,
    bool reverse
)
{
    if (reverse)
    {
        flagHasREV_ = true;
        reverseArrhenius_.A = A;
        reverseArrhenius_.n = n;
        reverseArrhenius_.E = E;
    }
    else
    {
        forwardArrhenius_.A = A;
        forwardArrhenius_.n = n;
        forwardArrhenius_.E = E;
    }
}